

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_173::ConstantFieldPropagation::run(ConstantFieldPropagation *this,Module *module)

{
  __node_base_ptr *this_00;
  __node_base_ptr *pp_Var1;
  bool bVar2;
  PassRunner *runner_00;
  reference __in;
  type *ptVar3;
  vector<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
  *this_01;
  size_type sVar4;
  Bool *this_02;
  StructValues<wasm::PossibleConstantValues> *pSVar5;
  PossibleConstantValues *this_03;
  PossibleConstantValues *other;
  FunctionOptimizer local_5c0;
  undefined1 local_470 [8];
  PCVStructValuesMap combinedInfos;
  TypeHierarchyPropagator<wasm::PossibleConstantValues> propagator;
  uint local_3d4;
  Index i;
  type *copied;
  type *type;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
  local_3b8;
  iterator __end2;
  iterator __begin2;
  BoolStructValuesMap *__range2;
  TypeHierarchyPropagator<wasm::(anonymous_namespace)::Bool> boolPropagator;
  PCVStructValuesMap rawNewInfos;
  SubTypes subTypes;
  BoolStructValuesMap combinedCopyInfos;
  PCVStructValuesMap combinedSetInfos;
  PCVStructValuesMap combinedNewInfos;
  PassRunner *runner;
  PCVScanner scanner;
  BoolFunctionStructValuesMap functionCopyInfos;
  undefined1 local_88 [8];
  PCVFunctionStructValuesMap functionSetInfos;
  PCVFunctionStructValuesMap functionNewInfos;
  Module *module_local;
  ConstantFieldPropagation *this_local;
  
  bVar2 = FeatureSet::hasGC(&module->features);
  if (bVar2) {
    StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>::FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::PossibleConstantValues> *)
               &functionSetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket,module);
    StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>::FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::PossibleConstantValues> *)local_88,module);
    StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::Bool>::FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::(anonymous_namespace)::Bool> *)
               &scanner.functionCopyInfos,module);
    PCVScanner::PCVScanner
              ((PCVScanner *)&runner,
               (PCVFunctionStructValuesMap *)
               &functionSetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket,(PCVFunctionStructValuesMap *)local_88,
               (BoolFunctionStructValuesMap *)&scanner.functionCopyInfos);
    runner_00 = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
           *)&runner,runner_00,module);
    WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    ::runOnModuleCode((WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                       *)&runner,runner_00,module);
    this_00 = &combinedSetInfos.
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
               ._M_h._M_single_bucket;
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::StructValuesMap
              ((StructValuesMap<wasm::PossibleConstantValues> *)this_00);
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::StructValuesMap
              ((StructValuesMap<wasm::PossibleConstantValues> *)
               &combinedCopyInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                ._M_h._M_single_bucket);
    StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>::combineInto
              ((FunctionStructValuesMap<wasm::PossibleConstantValues> *)
               &functionSetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket,(StructValuesMap<wasm::PossibleConstantValues> *)this_00);
    StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>::combineInto
              ((FunctionStructValuesMap<wasm::PossibleConstantValues> *)local_88,
               (StructValuesMap<wasm::PossibleConstantValues> *)
               &combinedCopyInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                ._M_h._M_single_bucket);
    pp_Var1 = &subTypes.typeSubTypes._M_h._M_single_bucket;
    StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>::StructValuesMap
              ((StructValuesMap<wasm::(anonymous_namespace)::Bool> *)pp_Var1);
    StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::Bool>::combineInto
              ((FunctionStructValuesMap<wasm::(anonymous_namespace)::Bool> *)
               &scanner.functionCopyInfos,
               (StructValuesMap<wasm::(anonymous_namespace)::Bool> *)pp_Var1);
    SubTypes::SubTypes((SubTypes *)
                       &rawNewInfos.
                        super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                        ._M_h._M_single_bucket,module);
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::StructValuesMap
              ((StructValuesMap<wasm::PossibleConstantValues> *)
               &boolPropagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    if ((this->refTest & 1U) != 0) {
      StructUtils::StructValuesMap<wasm::PossibleConstantValues>::operator=
                ((StructValuesMap<wasm::PossibleConstantValues> *)
                 &boolPropagator.subTypes.typeSubTypes._M_h._M_single_bucket,
                 (StructValuesMap<wasm::PossibleConstantValues> *)
                 &combinedSetInfos.
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                  ._M_h._M_single_bucket);
    }
    StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::Bool>::TypeHierarchyPropagator
              ((TypeHierarchyPropagator<wasm::(anonymous_namespace)::Bool> *)&__range2,
               (SubTypes *)
               &rawNewInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket);
    StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::Bool>::propagateToSubTypes
              ((TypeHierarchyPropagator<wasm::(anonymous_namespace)::Bool> *)&__range2,
               (StructValuesMap<wasm::(anonymous_namespace)::Bool> *)
               &subTypes.typeSubTypes._M_h._M_single_bucket);
    pp_Var1 = &subTypes.typeSubTypes._M_h._M_single_bucket;
    __end2 = std::
             unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
             ::begin((unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                      *)pp_Var1);
    local_3b8._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
         ::end((unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                *)pp_Var1);
    while (bVar2 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>
                              ,&local_3b8), bVar2) {
      __in = std::__detail::
             _Node_iterator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_false,_true>
             ::operator*(&__end2);
      ptVar3 = std::
               get<0ul,wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>>
                         (__in);
      this_01 = &std::
                 get<1ul,wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>>
                           (__in)->
                 super_vector<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
      ;
      for (local_3d4 = 0;
          sVar4 = std::
                  vector<wasm::(anonymous_namespace)::Bool,_std::allocator<wasm::(anonymous_namespace)::Bool>_>
                  ::size(this_01), local_3d4 < sVar4; local_3d4 = local_3d4 + 1) {
        this_02 = (Bool *)StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>::operator[]
                                    ((StructValues<wasm::(anonymous_namespace)::Bool> *)this_01,
                                     (ulong)local_3d4);
        bVar2 = wasm::(anonymous_namespace)::Bool::operator_cast_to_bool(this_02);
        if (bVar2) {
          pSVar5 = StructUtils::StructValuesMap<wasm::PossibleConstantValues>::operator[]
                             ((StructValuesMap<wasm::PossibleConstantValues> *)
                              &combinedCopyInfos.
                               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                               ._M_h._M_single_bucket,(HeapType)ptVar3->id);
          this_03 = StructUtils::StructValues<wasm::PossibleConstantValues>::operator[]
                              (pSVar5,(ulong)local_3d4);
          pSVar5 = StructUtils::StructValuesMap<wasm::PossibleConstantValues>::operator[]
                             ((StructValuesMap<wasm::PossibleConstantValues> *)
                              &combinedSetInfos.
                               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                               ._M_h._M_single_bucket,(HeapType)ptVar3->id);
          other = StructUtils::StructValues<wasm::PossibleConstantValues>::operator[]
                            (pSVar5,(ulong)local_3d4);
          PossibleConstantValues::combine(this_03,other);
        }
      }
      std::__detail::
      _Node_iterator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_false,_true>
      ::operator++(&__end2);
    }
    StructUtils::TypeHierarchyPropagator<wasm::PossibleConstantValues>::TypeHierarchyPropagator
              ((TypeHierarchyPropagator<wasm::PossibleConstantValues> *)
               &combinedInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket,
               (SubTypes *)
               &rawNewInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket);
    StructUtils::TypeHierarchyPropagator<wasm::PossibleConstantValues>::propagateToSuperTypes
              ((TypeHierarchyPropagator<wasm::PossibleConstantValues> *)
               &combinedInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket,
               (StructValuesMap<wasm::PossibleConstantValues> *)
               &combinedSetInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket);
    StructUtils::TypeHierarchyPropagator<wasm::PossibleConstantValues>::propagateToSuperAndSubTypes
              ((TypeHierarchyPropagator<wasm::PossibleConstantValues> *)
               &combinedInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket,
               (StructValuesMap<wasm::PossibleConstantValues> *)
               &combinedCopyInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                ._M_h._M_single_bucket);
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::StructValuesMap
              ((StructValuesMap<wasm::PossibleConstantValues> *)local_470,
               (StructValuesMap<wasm::PossibleConstantValues> *)
               &combinedSetInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket);
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::combineInto
              ((StructValuesMap<wasm::PossibleConstantValues> *)
               &combinedCopyInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                ._M_h._M_single_bucket,(StructValuesMap<wasm::PossibleConstantValues> *)local_470);
    FunctionOptimizer::FunctionOptimizer
              (&local_5c0,(PCVStructValuesMap *)local_470,
               (SubTypes *)
               &rawNewInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket,
               (PCVStructValuesMap *)&boolPropagator.subTypes.typeSubTypes._M_h._M_single_bucket,
               (bool)(this->refTest & 1));
    WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
    ::run(&local_5c0.
           super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
          ,runner_00,module);
    FunctionOptimizer::~FunctionOptimizer(&local_5c0);
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::~StructValuesMap
              ((StructValuesMap<wasm::PossibleConstantValues> *)local_470);
    StructUtils::TypeHierarchyPropagator<wasm::PossibleConstantValues>::~TypeHierarchyPropagator
              ((TypeHierarchyPropagator<wasm::PossibleConstantValues> *)
               &combinedInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket);
    StructUtils::TypeHierarchyPropagator<wasm::(anonymous_namespace)::Bool>::
    ~TypeHierarchyPropagator
              ((TypeHierarchyPropagator<wasm::(anonymous_namespace)::Bool> *)&__range2);
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::~StructValuesMap
              ((StructValuesMap<wasm::PossibleConstantValues> *)
               &boolPropagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    SubTypes::~SubTypes((SubTypes *)
                        &rawNewInfos.
                         super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                         ._M_h._M_single_bucket);
    StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>::~StructValuesMap
              ((StructValuesMap<wasm::(anonymous_namespace)::Bool> *)
               &subTypes.typeSubTypes._M_h._M_single_bucket);
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::~StructValuesMap
              ((StructValuesMap<wasm::PossibleConstantValues> *)
               &combinedCopyInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                ._M_h._M_single_bucket);
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::~StructValuesMap
              ((StructValuesMap<wasm::PossibleConstantValues> *)
               &combinedSetInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket);
    PCVScanner::~PCVScanner((PCVScanner *)&runner);
    StructUtils::FunctionStructValuesMap<wasm::(anonymous_namespace)::Bool>::
    ~FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::(anonymous_namespace)::Bool> *)
               &scanner.functionCopyInfos);
    StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>::~FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::PossibleConstantValues> *)local_88);
    StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>::~FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::PossibleConstantValues> *)
               &functionSetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    // Find and analyze all writes inside each function.
    PCVFunctionStructValuesMap functionNewInfos(*module),
      functionSetInfos(*module);
    BoolFunctionStructValuesMap functionCopyInfos(*module);
    PCVScanner scanner(functionNewInfos, functionSetInfos, functionCopyInfos);
    auto* runner = getPassRunner();
    scanner.run(runner, module);
    scanner.runOnModuleCode(runner, module);

    // Combine the data from the functions.
    PCVStructValuesMap combinedNewInfos, combinedSetInfos;
    functionNewInfos.combineInto(combinedNewInfos);
    functionSetInfos.combineInto(combinedSetInfos);
    BoolStructValuesMap combinedCopyInfos;
    functionCopyInfos.combineInto(combinedCopyInfos);

    // Prepare data we will need later.
    SubTypes subTypes(*module);

    PCVStructValuesMap rawNewInfos;
    if (refTest) {
      // The refTest optimizations require the raw new infos (see above), but we
      // can skip copying here if we'll never read this.
      rawNewInfos = combinedNewInfos;
    }

    // Handle subtyping. |combinedInfo| so far contains data that represents
    // each struct.new and struct.set's operation on the struct type used in
    // that instruction. That is, if we do a struct.set to type T, the value was
    // noted for type T. But our actual goal is to answer questions about
    // struct.gets. Specifically, when later we see:
    //
    //  (struct.get $A x (REF-1))
    //
    // Then we want to be aware of all the relevant struct.sets, that is, the
    // sets that can write data that this get reads. Given a set
    //
    //  (struct.set $B x (REF-2) (..value..))
    //
    // then
    //
    //  1. If $B is a subtype of $A, it is relevant: the get might read from a
    //     struct of type $B (i.e., REF-1 and REF-2 might be identical, and both
    //     be a struct of type $B).
    //  2. If $B is a supertype of $A that still has the field x then it may
    //     also be relevant: since $A is a subtype of $B, the set may write to a
    //     struct of type $A (and again, REF-1 and REF-2 may be identical).
    //
    // Thus, if either $A <: $B or $B <: $A then we must consider the get and
    // set to be relevant to each other. To make our later lookups for gets
    // efficient, we therefore propagate information about the possible values
    // in each field to both subtypes and supertypes.
    //
    // struct.new on the other hand knows exactly what type is being written to,
    // and so given a get of $A and a new of $B, the new is relevant for the get
    // iff $A is a subtype of $B, so we only need to propagate in one direction
    // there, to supertypes.
    //
    // An exception to the above are copies. If a field is copied then even
    // struct.new information cannot be assumed to be precise:
    //
    //   // A :> B :> C
    //   ..
    //   new B(20);
    //   ..
    //   A1->f0 = A2->f0; // Either of these might refer to an A, B, or C.
    //   ..
    //   foo(A->f0);      // These can contain 20,
    //   foo(C->f0);      // if the copy read from B.
    //
    // To handle that, copied fields are treated like struct.set ones (by
    // copying the struct.new data to struct.set). Note that we must propagate
    // copying to subtypes first, as in the example above the struct.new values
    // of subtypes must be taken into account (that is, A or a subtype is being
    // copied, so we want to do the same thing for B and C as well as A, since
    // a copy of A means it could be a copy of B or C).
    StructUtils::TypeHierarchyPropagator<Bool> boolPropagator(subTypes);
    boolPropagator.propagateToSubTypes(combinedCopyInfos);
    for (auto& [type, copied] : combinedCopyInfos) {
      for (Index i = 0; i < copied.size(); i++) {
        if (copied[i]) {
          combinedSetInfos[type][i].combine(combinedNewInfos[type][i]);
        }
      }
    }

    StructUtils::TypeHierarchyPropagator<PossibleConstantValues> propagator(
      subTypes);
    propagator.propagateToSuperTypes(combinedNewInfos);
    propagator.propagateToSuperAndSubTypes(combinedSetInfos);

    // Combine both sources of information to the final information that gets
    // care about.
    PCVStructValuesMap combinedInfos = std::move(combinedNewInfos);
    combinedSetInfos.combineInto(combinedInfos);

    // Optimize.
    // TODO: Skip this if we cannot optimize anything
    FunctionOptimizer(combinedInfos, subTypes, rawNewInfos, refTest)
      .run(runner, module);
  }